

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post.cpp
# Opt level: O2

void __thiscall Post::post_with_body::test_method(post_with_body *this)

{
  RequestDsl *pRVar1;
  Request *pRVar2;
  char local_568 [8];
  char text [392];
  undefined1 local_3d8 [8];
  Request result;
  Request should;
  Request local_2b8;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  char *local_78;
  char *local_70;
  string local_68;
  string local_48;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25;
  allocator<char> local_24;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  allocator<char> local_20;
  allocator<char> local_1f;
  allocator<char> local_1e;
  allocator<char> local_1d;
  allocator<char> local_1c;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  memcpy(local_568,
         "POST /uri.cgi HTTP/1.1\r\nFrom: user@example.com\r\nUser-Agent: Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0\r\nAccept: text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8\r\nAccept-Language: en-US,en;q=0.5\r\nAccept-Encoding: gzip, deflate\r\nContent-Type: application/x-www-form-urlencoded\r\nContent-Length: 31\r\nHost: 127.0.0.1\r\n\r\narg1=test;arg1=%20%21;arg3=test"
         ,0x188);
  PostFixture::parse((Request *)local_3d8,(PostFixture *)this,local_568,0x188);
  local_2b8.method._M_dataplus._M_p = (pointer)&local_2b8.method.field_2;
  local_2b8.uri._M_string_length = 0;
  local_2b8.uri.field_2._8_8_ = 0;
  local_2b8._121_7_ = 0;
  local_2b8.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2b8.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_2b8.method.field_2._M_allocated_capacity = 0;
  local_2b8.method.field_2._8_8_ = 0;
  local_2b8.method._M_string_length = 0;
  local_2b8.uri._M_dataplus._M_p = (pointer)&local_2b8.uri.field_2;
  local_2b8.uri.field_2._M_allocated_capacity = 0;
  local_2b8.versionMajor = 0;
  local_2b8.versionMinor = 0;
  local_2b8.headers.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.headers.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.headers.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_2b8.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_2b8.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = 0;
  local_2b8.keepAlive = false;
  std::__cxx11::string::assign((char *)&local_2b8);
  std::__cxx11::string::assign((char *)&local_2b8.uri);
  local_2b8.versionMajor = 1;
  local_2b8.versionMinor = 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"From",&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"user@example.com",&local_27);
  pRVar1 = RequestDsl::header((RequestDsl *)&local_2b8,&local_48,&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"User-Agent",&local_26);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,
             "Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0",&local_25);
  pRVar1 = RequestDsl::header(pRVar1,&local_238,&local_218);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Accept",&local_24);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8",
             &local_23);
  pRVar1 = RequestDsl::header(pRVar1,&local_1f8,&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Accept-Language",&local_22);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"en-US,en;q=0.5",&local_21);
  pRVar1 = RequestDsl::header(pRVar1,&local_1b8,&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"Accept-Encoding",&local_20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"gzip, deflate",&local_1f)
  ;
  pRVar1 = RequestDsl::header(pRVar1,&local_178,&local_158);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Content-Type",&local_1e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"application/x-www-form-urlencoded",&local_1d);
  pRVar1 = RequestDsl::header(pRVar1,&local_138,&local_118);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Content-Length",&local_1c)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"31",&local_1b);
  pRVar1 = RequestDsl::header(pRVar1,&local_f8,&local_d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Host",&local_1a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"127.0.0.1",&local_19);
  pRVar1 = RequestDsl::header(pRVar1,&local_b8,&local_98);
  pRVar2 = &RequestDsl::content<32ul>(pRVar1,(char (*) [32])"arg1=test;arg1=%20%21;arg3=test")->
            request;
  pRVar2->keepAlive = true;
  httpparser::Request::Request((Request *)&result.keepAlive,pRVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  httpparser::Request::~Request(&local_2b8);
  should._120_8_ = anon_var_dwarf_6d71;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&should.keepAlive,0x3e);
  local_2b8.method._M_string_length = local_2b8.method._M_string_length & 0xffffffffffffff00;
  local_2b8.method._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0010dd18;
  local_2b8.method.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b8.method.field_2._8_8_ = (long)"\n" + 1;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/post.cpp";
  local_70 = "";
  httpparser::Request::inspect_abi_cxx11_(&local_48,(Request *)local_3d8);
  httpparser::Request::inspect_abi_cxx11_(&local_68,(Request *)&result.keepAlive);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_2b8,&local_78,0x3e,1,2,&local_48,"result.inspect()",&local_68,"should.inspect()"
            );
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  httpparser::Request::~Request((Request *)&result.keepAlive);
  httpparser::Request::~Request((Request *)local_3d8);
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(post_with_body, PostFixture)
{
    const char text[] = "POST /uri.cgi HTTP/1.1\r\n"
                        "From: user@example.com\r\n"
                        "User-Agent: Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0\r\n"
                        "Accept: text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8\r\n"
                        "Accept-Language: en-US,en;q=0.5\r\n"
                        "Accept-Encoding: gzip, deflate\r\n"
                        "Content-Type: application/x-www-form-urlencoded\r\n"
                        "Content-Length: 31\r\n"
                        "Host: 127.0.0.1\r\n"
                        "\r\n"
                        "arg1=test;arg1=%20%21;arg3=test";
                       
    Request result = parse(text, sizeof(text));
    Request should = RequestDsl()
            .method("POST")
            .uri("/uri.cgi")
            .version(1, 1)
            .header("From", "user@example.com")
            .header("User-Agent", "Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0")
            .header("Accept", "text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8")
            .header("Accept-Language", "en-US,en;q=0.5")
            .header("Accept-Encoding", "gzip, deflate")
            .header("Content-Type", "application/x-www-form-urlencoded")
            .header("Content-Length", "31")
            .header("Host", "127.0.0.1")
            .content("arg1=test;arg1=%20%21;arg3=test")
            .keepAlive(true);
    
    BOOST_CHECK_EQUAL(result.inspect(), should.inspect());
}